

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O3

bool __thiscall
cmStringCommand::RegexMatch
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  long *plVar4;
  size_type *psVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  string input;
  string output;
  string e_1;
  string regex;
  string outvar;
  RegularExpression re;
  string local_1d8;
  undefined1 local_1b8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  char *local_118;
  undefined8 local_110;
  char local_108;
  undefined7 uStack_107;
  RegularExpression local_f8;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = pbVar1[2]._M_dataplus._M_p;
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_178,pcVar2,pcVar2 + pbVar1[2]._M_string_length);
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = pbVar1[3]._M_dataplus._M_p;
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_158,pcVar2,pcVar2 + pbVar1[3]._M_string_length);
  cmMakefile::ClearMatches((this->super_cmCommand).Makefile);
  local_f8.program = (char *)0x0;
  bVar3 = cmsys::RegularExpression::compile(&local_f8,local_178._M_dataplus._M_p);
  if (!bVar3) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                   "sub-command REGEX, mode MATCH failed to compile regex \"",&local_178);
    plVar4 = (long *)std::__cxx11::string::append(local_1b8);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_1d8.field_2._M_allocated_capacity = *psVar5;
      local_1d8.field_2._8_8_ = plVar4[3];
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    }
    else {
      local_1d8.field_2._M_allocated_capacity = *psVar5;
      local_1d8._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_1d8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1b8 + 0x10)) {
      operator_delete((void *)local_1b8._0_8_,CONCAT71(local_1b8._17_7_,local_1b8[0x10]) + 1);
    }
    cmCommand::SetError(&this->super_cmCommand,&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    bVar3 = false;
    goto LAB_0030dbdd;
  }
  local_1b8._8_8_ =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_1b8._0_8_ =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start + 4;
  local_110 = 0;
  local_108 = '\0';
  local_118 = &local_108;
  cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            (&local_1d8,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_1b8,&local_108);
  if (local_118 != &local_108) {
    operator_delete(local_118,CONCAT71(uStack_107,local_108) + 1);
  }
  local_1b8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_1b8[0x10] = '\0';
  local_1b8._0_8_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1b8 + 0x10);
  bVar3 = cmsys::RegularExpression::find(&local_f8,local_1d8._M_dataplus._M_p);
  if (bVar3) {
    cmMakefile::StoreMatches((this->super_cmCommand).Makefile,&local_f8);
    if (local_f8.endp[0] != local_f8.startp[0]) {
      std::__cxx11::string::substr((ulong)&local_198,(ulong)&local_1d8);
      std::__cxx11::string::operator=((string *)local_1b8,(string *)local_198._M_local_buf);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_allocated_capacity != &local_188) {
        operator_delete((void *)local_198._M_allocated_capacity,local_188._M_allocated_capacity + 1)
        ;
      }
      goto LAB_0030dae0;
    }
    std::operator+(&local_138,"sub-command REGEX, mode MATCH regex \"",&local_178);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_138);
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 == paVar6) {
      local_188._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_188._8_8_ = plVar4[3];
      local_198._M_allocated_capacity = (size_type)&local_188;
    }
    else {
      local_188._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_198._M_allocated_capacity =
           (size_type)
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar4;
    }
    local_198._8_8_ = plVar4[1];
    *plVar4 = (long)paVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    cmCommand::SetError(&this->super_cmCommand,(string *)&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_allocated_capacity != &local_188) {
      operator_delete((void *)local_198._M_allocated_capacity,local_188._M_allocated_capacity + 1);
    }
    bVar3 = false;
  }
  else {
LAB_0030dae0:
    bVar3 = true;
    cmMakefile::AddDefinition((this->super_cmCommand).Makefile,&local_158,(char *)local_1b8._0_8_);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1b8 + 0x10)) {
    operator_delete((void *)local_1b8._0_8_,CONCAT71(local_1b8._17_7_,local_1b8[0x10]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
LAB_0030dbdd:
  if (local_f8.program != (char *)0x0) {
    operator_delete__(local_f8.program);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool cmStringCommand::RegexMatch(std::vector<std::string> const& args)
{
  //"STRING(REGEX MATCH <regular_expression> <output variable>
  // <input> [<input>...])\n";
  std::string regex = args[2];
  std::string outvar = args[3];

  this->Makefile->ClearMatches();
  // Compile the regular expression.
  cmsys::RegularExpression re;
  if(!re.compile(regex.c_str()))
    {
    std::string e =
      "sub-command REGEX, mode MATCH failed to compile regex \""+regex+"\".";
    this->SetError(e);
    return false;
    }

  // Concatenate all the last arguments together.
  std::string input = cmJoin(cmMakeRange(args).advance(4), std::string());

  // Scan through the input for all matches.
  std::string output;
  if(re.find(input.c_str()))
    {
    this->Makefile->StoreMatches(re);
    std::string::size_type l = re.start();
    std::string::size_type r = re.end();
    if(r-l == 0)
      {
      std::string e =
        "sub-command REGEX, mode MATCH regex \""+regex+
        "\" matched an empty string.";
      this->SetError(e);
      return false;
      }
    output = input.substr(l, r-l);
    }

  // Store the output in the provided variable.
  this->Makefile->AddDefinition(outvar, output.c_str());
  return true;
}